

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void remove_from_bucket(ecs_bucket_t *bucket,ecs_size_t elem_size,ecs_map_key_t key,int32_t index)

{
  int iVar1;
  ecs_map_key_t *last_elem;
  ecs_map_key_t *elem;
  int32_t bucket_count;
  int32_t index_local;
  ecs_map_key_t key_local;
  ecs_size_t elem_size_local;
  ecs_bucket_t *bucket_local;
  
  _ecs_assert(bucket->count != 0,0xc,(char *)0x0,"bucket->count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x99);
  if (bucket->count == 0) {
    __assert_fail("bucket->count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x99,
                  "void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)");
  }
  _ecs_assert(index < bucket->count,0xc,(char *)0x0,"index < bucket->count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x9a);
  if (index < bucket->count) {
    iVar1 = bucket->count + -1;
    bucket->count = iVar1;
    if (index != bucket->count) {
      _ecs_assert(key == bucket->keys[index],0xc,(char *)0x0,"key == bucket->keys[index]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0x9f);
      if (key != bucket->keys[index]) {
        __assert_fail("key == bucket->keys[index]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                      ,0x9f,
                      "void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)")
        ;
      }
      bucket->keys[index] = bucket->keys[iVar1];
      memcpy((void *)((long)bucket->payload + (long)(elem_size * index)),
             (void *)((long)bucket->payload + (long)(elem_size * bucket->count)),(long)elem_size);
    }
    return;
  }
  __assert_fail("index < bucket->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x9a,"void remove_from_bucket(ecs_bucket_t *, ecs_size_t, ecs_map_key_t, int32_t)")
  ;
}

Assistant:

static
void remove_from_bucket(
    ecs_bucket_t *bucket,
    ecs_size_t elem_size,
    ecs_map_key_t key,
    int32_t index)
{
    (void)key;

    ecs_assert(bucket->count != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(index < bucket->count, ECS_INTERNAL_ERROR, NULL);
    
    int32_t bucket_count = -- bucket->count;

    if (index != bucket->count) {
        ecs_assert(key == bucket->keys[index], ECS_INTERNAL_ERROR, NULL);
        bucket->keys[index] = bucket->keys[bucket_count];

        ecs_map_key_t *elem = GET_ELEM(bucket->payload, elem_size, index);
        ecs_map_key_t *last_elem = GET_ELEM(bucket->payload, elem_size, bucket->count);

        ecs_os_memcpy(elem, last_elem, elem_size);
    }
}